

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall SQVM::ObjCmp(SQVM *this,SQObjectPtr *o1,SQObjectPtr *o2,SQInteger *result)

{
  SQObjectValue *pSVar1;
  float fVar2;
  SQObjectType SVar3;
  SQObjectType SVar4;
  long lVar5;
  long lVar6;
  SQTable *pSVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  SQMetaMethod mm;
  byte unaff_R13B;
  float fVar11;
  SQObjectPtr res;
  SQObjectPtr closure;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  SVar3 = (o1->super_SQObject)._type;
  SVar4 = (o2->super_SQObject)._type;
  if (SVar3 != SVar4) {
    if (((SVar3 & SVar4) >> 0x1a & 1) == 0) {
      if (SVar3 != OT_NULL) {
        if (SVar4 != OT_NULL) {
          Raise_CompareError(this,&o1->super_SQObject,&o2->super_SQObject);
          unaff_R13B = 0;
          goto LAB_0012a6a5;
        }
        goto LAB_0012a62c;
      }
LAB_0012a623:
      *result = -1;
    }
    else {
      if (SVar4 == OT_FLOAT && SVar3 == OT_INTEGER) {
        fVar11 = (float)(o1->super_SQObject)._unVal.nInteger;
        fVar2 = (o2->super_SQObject)._unVal.fFloat;
        if ((fVar2 != fVar11) || (NAN(fVar2) || NAN(fVar11))) {
          if (fVar11 < fVar2) goto LAB_0012a623;
LAB_0012a62c:
          *result = 1;
          goto LAB_0012a633;
        }
      }
      else {
        fVar11 = (float)(o2->super_SQObject)._unVal.nInteger;
        fVar2 = (o1->super_SQObject)._unVal.fFloat;
        if ((fVar2 != fVar11) || (NAN(fVar2) || NAN(fVar11))) {
          if (fVar2 < fVar11) goto LAB_0012a623;
          goto LAB_0012a62c;
        }
      }
LAB_0012a577:
      *result = 0;
    }
LAB_0012a633:
    unaff_R13B = 1;
    goto LAB_0012a6a5;
  }
  lVar5 = (o1->super_SQObject)._unVal.nInteger;
  lVar6 = (o2->super_SQObject)._unVal.nInteger;
  if (lVar5 == lVar6) goto LAB_0012a577;
  local_50.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_50.super_SQObject._type = OT_NULL;
  if ((int)SVar3 < 0xa000020) {
    if (SVar3 == OT_INTEGER) {
      bVar8 = lVar6 <= lVar5;
LAB_0012a652:
      uVar10 = (ulong)bVar8 * 2 - 1;
    }
    else {
      if (SVar3 == OT_FLOAT) {
        fVar2 = (o2->super_SQObject)._unVal.fFloat;
        pSVar1 = &(o1->super_SQObject)._unVal;
        bVar8 = fVar2 < pSVar1->fFloat || fVar2 == pSVar1->fFloat;
        goto LAB_0012a652;
      }
      if (SVar3 != OT_STRING) goto LAB_0012a684;
      iVar9 = strcmp((char *)&((o1->super_SQObject)._unVal.pOuter)->_idx,
                     (char *)&((o2->super_SQObject)._unVal.pOuter)->_idx);
      uVar10 = (ulong)iVar9;
    }
LAB_0012a695:
    *result = uVar10;
    unaff_R13B = 1;
  }
  else {
    if ((((SVar3 != OT_TABLE) && (SVar3 != OT_USERDATA)) && (SVar3 != OT_INSTANCE)) ||
       (pSVar7 = (o1->super_SQObject)._unVal.pTable,
       (pSVar7->super_SQDelegable)._delegate == (SQTable *)0x0)) {
LAB_0012a684:
      uVar10 = -(ulong)((o1->super_SQObject)._unVal.pTable < (o2->super_SQObject)._unVal.pTable) | 1
      ;
      goto LAB_0012a695;
    }
    local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
    local_40.super_SQObject._type = OT_NULL;
    iVar9 = (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [6])(pSVar7,this,10);
    if ((char)iVar9 != '\0') {
      Push(this,o1);
      Push(this,o2);
      bVar8 = CallMetaMethod(this,&local_40,mm,2,&local_50);
      if (bVar8) {
        if (local_50.super_SQObject._type == OT_INTEGER) {
          *result = (SQInteger)local_50.super_SQObject._unVal;
          unaff_R13B = 1;
        }
        else {
          unaff_R13B = 0;
          Raise_Error(this,"_cmp must return an integer");
        }
      }
      else {
        unaff_R13B = 0;
      }
    }
    SQObjectPtr::~SQObjectPtr(&local_40);
    if ((char)iVar9 == '\0') goto LAB_0012a684;
  }
  SQObjectPtr::~SQObjectPtr(&local_50);
LAB_0012a6a5:
  return (bool)(unaff_R13B & 1);
}

Assistant:

bool SQVM::ObjCmp(const SQObjectPtr &o1,const SQObjectPtr &o2,SQInteger &result)
{
    SQObjectType t1 = type(o1), t2 = type(o2);
    if(t1 == t2) {
        if(_rawval(o1) == _rawval(o2))_RET_SUCCEED(0);
        SQObjectPtr res;
        switch(t1){
        case OT_STRING:
            _RET_SUCCEED(scstrcmp(_stringval(o1),_stringval(o2)));
        case OT_INTEGER:
            _RET_SUCCEED((_integer(o1)<_integer(o2))?-1:1);
        case OT_FLOAT:
            _RET_SUCCEED((_float(o1)<_float(o2))?-1:1);
        case OT_TABLE:
        case OT_USERDATA:
        case OT_INSTANCE:
            if(_delegable(o1)->_delegate) {
                SQObjectPtr closure;
                if(_delegable(o1)->GetMetaMethod(this, MT_CMP, closure)) {
                    Push(o1);Push(o2);
                    if(CallMetaMethod(closure,MT_CMP,2,res)) {
                        if(type(res) != OT_INTEGER) {
                            Raise_Error(_SC("_cmp must return an integer"));
                            return false;
                        }
                        _RET_SUCCEED(_integer(res))
                    }
                    return false;
                }
            }
            //continues through (no break needed)
        default:
            _RET_SUCCEED( _userpointer(o1) < _userpointer(o2)?-1:1 );
        }
        assert(0);
        //if(type(res)!=OT_INTEGER) { Raise_CompareError(o1,o2); return false; }
        //  _RET_SUCCEED(_integer(res));

    }
    else{
        if(sq_isnumeric(o1) && sq_isnumeric(o2)){
            if((t1==OT_INTEGER) && (t2==OT_FLOAT)) {
                if( _integer(o1)==_float(o2) ) { _RET_SUCCEED(0); }
                else if( _integer(o1)<_float(o2) ) { _RET_SUCCEED(-1); }
                _RET_SUCCEED(1);
            }
            else{
                if( _float(o1)==_integer(o2) ) { _RET_SUCCEED(0); }
                else if( _float(o1)<_integer(o2) ) { _RET_SUCCEED(-1); }
                _RET_SUCCEED(1);
            }
        }
        else if(t1==OT_NULL) {_RET_SUCCEED(-1);}
        else if(t2==OT_NULL) {_RET_SUCCEED(1);}
        else { Raise_CompareError(o1,o2); return false; }

    }
    assert(0);
    _RET_SUCCEED(0); //cannot happen
}